

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddTargetDepends
          (cmGlobalGenerator *this,cmGeneratorTarget *target,TargetDependSet *projectTargets)

{
  bool bVar1;
  reference this_00;
  cmGeneratorTarget *target_00;
  pair<std::_Rb_tree_const_iterator<cmTargetDepend>,_bool> pVar2;
  _Self local_68;
  _Self local_60;
  const_iterator i;
  TargetDependSet *ts;
  cmTargetDepend local_40;
  _Base_ptr local_30;
  undefined1 local_28;
  TargetDependSet *local_20;
  TargetDependSet *projectTargets_local;
  cmGeneratorTarget *target_local;
  cmGlobalGenerator *this_local;
  
  local_20 = projectTargets;
  projectTargets_local = (TargetDependSet *)target;
  target_local = (cmGeneratorTarget *)this;
  cmTargetDepend::cmTargetDepend(&local_40,target);
  pVar2 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
          insert(&projectTargets->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 ,&local_40);
  local_30 = (_Base_ptr)pVar2.first._M_node;
  local_28 = pVar2.second;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    i._M_node = (_Base_ptr)GetTargetDirectDepends(this,(cmGeneratorTarget *)projectTargets_local);
    local_60._M_node =
         (_Base_ptr)
         std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::begin
                   ((set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                     *)i._M_node);
    while( true ) {
      local_68._M_node =
           (_Base_ptr)
           std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                     (i._M_node);
      bVar1 = std::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      this_00 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&local_60);
      target_00 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(this_00);
      AddTargetDepends(this,target_00,local_20);
      std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&local_60);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddTargetDepends(cmGeneratorTarget const* target,
                                         TargetDependSet& projectTargets)
{
  // add the target itself
  if(projectTargets.insert(target).second)
    {
    // This is the first time we have encountered the target.
    // Recursively follow its dependencies.
    TargetDependSet const& ts = this->GetTargetDirectDepends(target);
    for(TargetDependSet::const_iterator i = ts.begin(); i != ts.end(); ++i)
      {
      this->AddTargetDepends(*i, projectTargets);
      }
    }
}